

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O0

iterator __thiscall
fmt::v5::formatter<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_char,_void>::parse
          (formatter<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_char,_void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  iterator pcVar1;
  char *s;
  type count;
  spec_handler *in_RDI;
  chrono_format_checker *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  spec_handler handler;
  iterator end;
  iterator begin;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffa0;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffb0;
  formatter<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_char,_void>
  *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  spec_handler *begin_00;
  iterator local_8;
  
  local_8 = basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
                      (in_stack_ffffffffffffffa0);
  pcVar1 = basic_parse_context<char,_fmt::v5::internal::error_handler>::end
                     ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x139631);
  if ((local_8 != pcVar1) &&
     (begin_00 = in_RDI,
     local_8 = internal::
               parse_align<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000000000l>>,char,void>::spec_handler&>
                         ((char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,in_RDI
                         ), local_8 != pcVar1)) {
    s = internal::
        parse_width<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000000000l>>,char,void>::spec_handler&>
                  ((char *)begin_00,in_stack_ffffffffffffffc0,
                   (spec_handler *)in_stack_ffffffffffffffb8);
    local_8 = internal::parse_chrono_format<char,fmt::v5::internal::chrono_format_checker>
                        (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    count = internal::to_unsigned<long>((long)local_8 - (long)s);
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffb0,s,count);
    in_RDI[2].context = in_stack_ffffffffffffffb0;
    in_RDI[3].f = in_stack_ffffffffffffffb8;
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto parse(basic_parse_context<Char> &ctx)
      -> decltype(ctx.begin()) {
    auto begin = ctx.begin(), end = ctx.end();
    if (begin == end) return begin;
    spec_handler handler{*this, ctx};
    begin = internal::parse_align(begin, end, handler);
    if (begin == end) return begin;
    begin = internal::parse_width(begin, end, handler);
    end = parse_chrono_format(begin, end, internal::chrono_format_checker());
    format_str = basic_string_view<Char>(&*begin, internal::to_unsigned(end - begin));
    return end;
  }